

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlOutputBufferWrite(void)

{
  int iVar1;
  int iVar2;
  xmlOutputBufferPtr val;
  char *val_00;
  int local_3c;
  int n_data;
  char *data;
  int local_28;
  int n_len;
  int len;
  int n_out;
  xmlOutputBufferPtr out;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_len = 0; n_len < 2; n_len = n_len + 1) {
    for (data._4_4_ = 0; (int)data._4_4_ < 4; data._4_4_ = data._4_4_ + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlOutputBufferPtr(n_len,0);
        local_28 = gen_int(data._4_4_,1);
        val_00 = gen_const_char_ptr(local_3c,2);
        if (val_00 != (char *)0x0) {
          iVar2 = xmlStrlen(val_00);
          if (iVar2 < local_28) {
            local_28 = 0;
          }
        }
        iVar2 = xmlOutputBufferWrite(val,local_28,val_00);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlOutputBufferPtr(n_len,val,0);
        des_int(data._4_4_,local_28,1);
        des_const_char_ptr(local_3c,val_00,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlOutputBufferWrite",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d",(ulong)data._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlOutputBufferWrite(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    xmlOutputBufferPtr out; /* a buffered parser output */
    int n_out;
    int len; /* the size in bytes of the array. */
    int n_len;
    const char * data; /* an char array */
    int n_data;

    for (n_out = 0;n_out < gen_nb_xmlOutputBufferPtr;n_out++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
    for (n_data = 0;n_data < gen_nb_const_char_ptr;n_data++) {
        mem_base = xmlMemBlocks();
        out = gen_xmlOutputBufferPtr(n_out, 0);
        len = gen_int(n_len, 1);
        data = gen_const_char_ptr(n_data, 2);
        if ((data != NULL) &&
            (len > xmlStrlen(BAD_CAST data)))
            len = 0;

        ret_val = xmlOutputBufferWrite(out, len, data);
        desret_int(ret_val);
        call_tests++;
        des_xmlOutputBufferPtr(n_out, out, 0);
        des_int(n_len, len, 1);
        des_const_char_ptr(n_data, data, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlOutputBufferWrite",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf(" %d", n_len);
            printf(" %d", n_data);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}